

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sattrack.cc
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int iVar2;
  DateTime dt;
  CoordTopocentric topo;
  CoordGeodetic geo;
  Eci eci;
  Tle tle;
  Observer obs;
  SGP4 sgp4;
  DateTime local_520;
  string local_518;
  string local_4f8;
  string local_4d8;
  CoordTopocentric local_4b8;
  CoordGeodetic local_498;
  Eci local_480;
  Tle local_438;
  Observer local_360;
  SGP4 local_300;
  
  libsgp4::Observer::Observer(&local_360,51.507406923983446,-0.12773752212524414,0.05);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,"UK-DMC 2                ",(allocator<char> *)&local_300);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f8,
             "1 35683U 09041C   12289.23158813  .00000484  00000-0  89219-4 0  5863",
             (allocator<char> *)&local_480);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,
             "2 35683  98.0221 185.3682 0001499 100.5295 259.6088 14.69819587172294",
             (allocator<char> *)&local_4b8);
  libsgp4::Tle::Tle(&local_438,&local_4d8,&local_4f8,&local_518);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_4d8);
  libsgp4::SGP4::SGP4(&local_300,&local_438);
  poVar1 = libsgp4::operator<<((ostream *)&std::cout,&local_438);
  std::endl<char,std::char_traits<char>>(poVar1);
  for (iVar2 = 0; iVar2 != 100; iVar2 = iVar2 + 10) {
    local_520.m_encoded = (long)((double)iVar2 * 60000000.0) + local_438.epoch_.m_encoded;
    libsgp4::SGP4::FindPosition(&local_480,&local_300,&local_520);
    libsgp4::Observer::GetLookAngle(&local_4b8,&local_360,&local_480);
    libsgp4::Eci::ToGeodetic(&local_498,&local_480);
    poVar1 = libsgp4::operator<<((ostream *)&std::cout,&local_520);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = libsgp4::operator<<(poVar1,&local_4b8);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = libsgp4::operator<<(poVar1,&local_498);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  libsgp4::Tle::~Tle(&local_438);
  return 0;
}

Assistant:

int main()
{
    libsgp4::Observer obs(51.507406923983446, -0.12773752212524414, 0.05);
    libsgp4::Tle tle = libsgp4::Tle("UK-DMC 2                ",
        "1 35683U 09041C   12289.23158813  .00000484  00000-0  89219-4 0  5863",
        "2 35683  98.0221 185.3682 0001499 100.5295 259.6088 14.69819587172294");
    libsgp4::SGP4 sgp4(tle);

    std::cout << tle << std::endl;

    for (int i = 0; i < 10; ++i)
    {
        libsgp4::DateTime dt = tle.Epoch().AddMinutes(i * 10);
        /*
         * calculate satellite position
         */
        libsgp4::Eci eci = sgp4.FindPosition(dt);
        /*
         * get look angle for observer to satellite
         */
        libsgp4::CoordTopocentric topo = obs.GetLookAngle(eci);
        /*
         * convert satellite position to geodetic coordinates
         */
        libsgp4::CoordGeodetic geo = eci.ToGeodetic();

        std::cout << dt << " " << topo << " " << geo << std::endl;
    };

    return 0;
}